

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O1

void __thiscall
chrono::utils::ChISO2631_1_AVTransition::Config
          (ChISO2631_1_AVTransition *this,double step,double f4,double Q4)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar6._8_56_ = in_register_00001288;
  auVar6._0_8_ = Q4;
  this->m_Ts = step;
  this->m_wc3 = 0.0;
  dVar1 = f4 * 6.283185307179586;
  this->m_wc4 = dVar1;
  this->m_Q4 = Q4;
  dVar4 = dVar1 * step * Q4 * step;
  dVar2 = dVar1 * (Q4 + Q4) * step * step;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar4;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (step + step) * dVar1;
  auVar10 = vfmadd231sd_fma(auVar10,auVar7,auVar5);
  auVar10 = vfmadd231sd_fma(auVar10,auVar6._0_16_,ZEXT816(0x4010000000000000));
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = Q4 * -8.0;
  auVar8 = vfmadd231sd_fma(auVar11,auVar5,auVar8);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = step * -2.0 * dVar1;
  auVar3 = vfmadd231sd_fma(auVar3,auVar7,auVar5);
  auVar3 = vfmadd231sd_fma(auVar3,auVar6._0_16_,ZEXT816(0x4010000000000000));
  dVar9 = auVar10._0_8_;
  dVar4 = (dVar1 * dVar4) / dVar9;
  this->m_b0 = dVar4;
  this->m_b1 = (dVar1 * dVar2) / dVar9;
  this->m_b2 = dVar4;
  this->m_a1 = auVar8._0_8_ / dVar9;
  this->m_a2 = auVar3._0_8_ / dVar9;
  this->m_a0 = 1.0;
  this->m_u_hist1 = 0.0;
  this->m_u_hist2 = 0.0;
  this->m_y_hist1 = 0.0;
  this->m_y_hist2 = 0.0;
  return;
}

Assistant:

void ChISO2631_1_AVTransition::Config(double step, double f4, double Q4) {
    // Standard Bilinear Transform
    m_Ts = step;
    m_wc3 = 0.0;
    m_wc4 = CH_C_2PI * f4;
    m_Q4 = Q4;

    m_b0 = m_Q4 * m_Ts * m_Ts * m_wc4 * m_wc4;
    m_b1 = 2.0 * m_Q4 * m_Ts * m_Ts * m_wc4 * m_wc4;
    m_b2 = m_Q4 * m_Ts * m_Ts * m_wc4 * m_wc4;

    m_a0 = m_Q4 * m_Ts * m_Ts * m_wc4 * m_wc4 + 2.0 * m_Ts * m_wc4 + 4.0 * m_Q4;
    m_a1 = 2.0 * m_Q4 * m_Ts * m_Ts * m_wc4 * m_wc4 - 8.0 * m_Q4;
    m_a2 = m_Q4 * m_Ts * m_Ts * m_wc4 * m_wc4 - 2.0 * m_Ts * m_wc4 + 4.0 * m_Q4;

    m_b0 /= m_a0;
    m_b1 /= m_a0;
    m_b2 /= m_a0;

    m_a1 /= m_a0;
    m_a2 /= m_a0;
    m_a0 = 1.0;

    Reset();
}